

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O2

_Bool BinarySink_put_pstring(BinarySink *bs,char *str)

{
  size_t sVar1;
  undefined1 local_19;
  
  sVar1 = strlen(str);
  if (sVar1 < 0x100) {
    local_19 = (undefined1)sVar1;
    (*bs->write)(bs,&local_19,1);
    (*bs->write)(bs,str,sVar1);
  }
  return sVar1 < 0x100;
}

Assistant:

bool BinarySink_put_pstring(BinarySink *bs, const char *str)
{
    size_t len = strlen(str);
    if (len > 255)
        return false; /* can't write a Pascal-style string this long */
    BinarySink_put_byte(bs, len);
    bs->write(bs, str, len);
    return true;
}